

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap_array_benchmark.cc
# Opt level: O0

int main(int argc,char **argv)

{
  TimeStamp TVar1;
  TimeStamp TVar2;
  unsigned_long uVar3;
  SignedBitmapArray<long> *pSVar4;
  void *pvVar5;
  undefined8 *in_RSI;
  int in_EDI;
  size_t i_5;
  int64_t sum_2;
  size_t i_4;
  int64_t *array_2;
  size_t i_3;
  int64_t sum_1;
  size_t i_2;
  SignedBitmapArray<long> array_1;
  size_t i_1;
  int64_t sum;
  size_t i;
  UnsignedBitmapArray<unsigned_long> array;
  TimeStamp t1;
  TimeStamp t0;
  pos_type in_stack_fffffffffffffed8;
  UnsignedBitmapArray<unsigned_long> *in_stack_fffffffffffffee0;
  pos_type in_stack_fffffffffffffee8;
  SignedBitmapArray<long> *in_stack_fffffffffffffef0;
  SignedBitmapArray<long> *this;
  ulong local_d0;
  long local_c8;
  ulong local_c0;
  ulong local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_70;
  long local_68;
  ulong local_60;
  
  if (1 < in_EDI) {
    fprintf(_stderr,"%s does not take any arguments.\n",*in_RSI);
  }
  bitmap::UnsignedBitmapArray<unsigned_long>::UnsignedBitmapArray
            ((UnsignedBitmapArray<unsigned_long> *)in_stack_fffffffffffffef0,
             in_stack_fffffffffffffee8,(width_type)((ulong)in_stack_fffffffffffffee0 >> 0x38));
  TVar1 = GetTimestamp();
  for (local_60 = 0; local_60 < 0x6400000; local_60 = local_60 + 1) {
    bitmap::UnsignedBitmapArray<unsigned_long>::Set
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,0x102710);
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to fill Unsigned Bitmap Array = %llu\n",TVar2 - TVar1);
  local_68 = 0;
  TVar1 = GetTimestamp();
  for (local_70 = 0; local_70 < 0x6400000; local_70 = local_70 + 1) {
    uVar3 = bitmap::UnsignedBitmapArray<unsigned_long>::Get
                      (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_68 = uVar3 + local_68;
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to read Unsigned Bitmap Array = %llu; sum=%lld\n",TVar2 - TVar1,local_68);
  bitmap::UnsignedBitmapArray<unsigned_long>::~UnsignedBitmapArray
            ((UnsignedBitmapArray<unsigned_long> *)0x102873);
  bitmap::SignedBitmapArray<long>::SignedBitmapArray
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (width_type)((ulong)in_stack_fffffffffffffee0 >> 0x38));
  TVar1 = GetTimestamp();
  for (local_a0 = 0; local_a0 < 0x6400000; local_a0 = local_a0 + 1) {
    bitmap::SignedBitmapArray<long>::Set
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,(long)in_stack_fffffffffffffee0);
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to fill Signed Bitmap Array = %llu\n",TVar2 - TVar1);
  local_a8 = 0;
  pSVar4 = (SignedBitmapArray<long> *)GetTimestamp();
  this = pSVar4;
  for (local_b0 = 0; local_b0 < 0x6400000; local_b0 = local_b0 + 1) {
    in_stack_fffffffffffffee8 = bitmap::SignedBitmapArray<long>::Get(this,in_stack_fffffffffffffee8)
    ;
    local_a8 = in_stack_fffffffffffffee8 + local_a8;
  }
  TVar1 = GetTimestamp();
  fprintf(_stderr,"Time to read Signed Bitmap Array = %llu; sum=%lld\n",TVar1 - (long)pSVar4,
          local_a8);
  bitmap::SignedBitmapArray<long>::~SignedBitmapArray((SignedBitmapArray<long> *)0x102a26);
  pvVar5 = operator_new__(0x32000000);
  TVar1 = GetTimestamp();
  for (local_c0 = 0; local_c0 < 0x6400000; local_c0 = local_c0 + 1) {
    *(ulong *)((long)pvVar5 + local_c0 * 8) = local_c0;
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to fill Array = %llu\n",TVar2 - TVar1);
  local_c8 = 0;
  TVar1 = GetTimestamp();
  for (local_d0 = 0; local_d0 < 0x6400000; local_d0 = local_d0 + 1) {
    local_c8 = *(long *)((long)pvVar5 + local_d0 * 8) + local_c8;
  }
  TVar2 = GetTimestamp();
  fprintf(_stderr,"Time to read Array = %llu; sum=%lld\n",TVar2 - TVar1,local_c8);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  if (argc > 1) {
    fprintf(stderr, "%s does not take any arguments.\n", argv[0]);
  }

  TimeStamp t0, t1;

  {
    bitmap::UnsignedBitmapArray<uint64_t> array(ARRAY_SIZE, 30);

    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array.Set(i, i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Unsigned Bitmap Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      // assert(array[i] == i);
      sum += array.Get(i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to read Unsigned Bitmap Array = %llu; sum=%lld\n",
            (t1 - t0), sum);
  }
  {
    bitmap::SignedBitmapArray<int64_t> array(ARRAY_SIZE, 30);

    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array.Set(i, i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Signed Bitmap Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      // assert(array[i] == i);
      sum += array.Get(i);
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to read Signed Bitmap Array = %llu; sum=%lld\n",
            (t1 - t0), sum);
  }

  {
    int64_t *array = new int64_t[ARRAY_SIZE];
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      array[i] = i;
    }
    t1 = GetTimestamp();

    fprintf(stderr, "Time to fill Array = %llu\n", (t1 - t0));

    int64_t sum = 0;
    t0 = GetTimestamp();
    for (size_t i = 0; i < ARRAY_SIZE; i++) {
      sum += array[i];
    }
    t1 = GetTimestamp();
    fprintf(stderr, "Time to read Array = %llu; sum=%lld\n", (t1 - t0), sum);
  }
}